

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O3

int divbwt(uchar *T,uchar *U,int *A,int n,uchar *num_indexes,int *indexes,int openMP)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  uint *SA;
  int *piVar4;
  int *bucket_B;
  ulong uVar5;
  byte bVar6;
  ulong uVar7;
  ulong uVar8;
  uint *puVar9;
  uint uVar10;
  uint uVar11;
  uint *puVar12;
  ulong uVar13;
  char *pcVar14;
  uint uVar15;
  byte bVar16;
  int openMP_00;
  uint uVar17;
  long lVar18;
  ulong uVar19;
  uint *puVar20;
  uint *puVar21;
  uint uVar22;
  bool bVar23;
  
  iVar2 = -1;
  if (-1 < n && (U != (uchar *)0x0 && T != (uchar *)0x0)) {
    if ((uint)n < 2) {
      iVar2 = 0;
      if (n == 1) {
        *U = *T;
        iVar2 = 1;
      }
    }
    else {
      piVar4 = indexes;
      SA = (uint *)A;
      if (A == (int *)0x0) {
        SA = (uint *)malloc((ulong)(uint)n * 4 + 4);
      }
      openMP_00 = (int)piVar4;
      piVar4 = (int *)malloc(0x400);
      bucket_B = (int *)malloc(0x40000);
      iVar2 = -2;
      if (bucket_B != (int *)0x0 && (piVar4 != (int *)0x0 && SA != (uint *)0x0)) {
        iVar2 = sort_typeBstar(T,(int *)SA,piVar4,bucket_B,n,openMP_00);
        if (num_indexes == (uchar *)0x0 || indexes == (int *)0x0) {
          if (0 < iVar2) {
            uVar7 = 0xfe;
            do {
              uVar10 = (int)uVar7 << 8;
              iVar2 = bucket_B[(int)((int)uVar7 + 1U | uVar10)];
              puVar9 = SA + (long)piVar4[uVar7 + 1] + -1;
              if (SA + iVar2 <= puVar9) {
                uVar17 = 0xffffffff;
                puVar12 = (uint *)0x0;
                do {
                  uVar15 = *puVar9;
                  uVar19 = (ulong)uVar15;
                  if ((int)uVar15 < 1) {
                    if (uVar19 == 0) {
                      if (uVar7 != *T) {
                        __assert_fail("T[s] == c1",
                                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                                      ,0xbb6a,
                                      "int construct_BWT(const unsigned char *, int *, int *, int *, int, int)"
                                     );
                      }
                    }
                    else {
                      *puVar9 = ~uVar15;
                    }
                  }
                  else {
                    bVar6 = T[uVar19];
                    if (uVar7 != bVar6) {
                      __assert_fail("T[s] == c1",
                                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                                    ,0xbb5a,
                                    "int construct_BWT(const unsigned char *, int *, int *, int *, int, int)"
                                   );
                    }
                    if ((n <= (int)(uVar19 + 1)) || (T[uVar19 + 1] < bVar6)) {
                      __assert_fail("((s + 1) < n) && (T[s] <= T[s + 1])",
                                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                                    ,0xbb5b,
                                    "int construct_BWT(const unsigned char *, int *, int *, int *, int, int)"
                                   );
                    }
                    if (bVar6 < T[uVar19 - 1]) {
                      __assert_fail("T[s - 1] <= T[s]",
                                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                                    ,0xbb5c,
                                    "int construct_BWT(const unsigned char *, int *, int *, int *, int, int)"
                                   );
                    }
                    bVar6 = T[uVar15 - 1];
                    uVar8 = (ulong)bVar6;
                    *puVar9 = ~(uint)bVar6;
                    uVar22 = 0;
                    if ((uVar19 != 1) && (uVar22 = uVar15 - 1, bVar6 < T[uVar19 - 2])) {
                      uVar22 = -uVar15;
                    }
                    if (uVar17 == bVar6) {
                      uVar8 = (ulong)uVar17;
                    }
                    else {
                      if (-1 < (int)uVar17) {
                        bucket_B[(int)(uVar17 | uVar10)] =
                             (int)((ulong)((long)puVar12 - (long)SA) >> 2);
                      }
                      puVar12 = SA + bucket_B[(long)(int)uVar10 | uVar8];
                    }
                    if (puVar9 <= puVar12) {
                      pcVar14 = "k < j";
LAB_0018a33b:
                      __assert_fail(pcVar14,
                                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                                    ,0xbb64,
                                    "int construct_BWT(const unsigned char *, int *, int *, int *, int, int)"
                                   );
                    }
                    if (puVar12 == (uint *)0x0) {
                      pcVar14 = "k != NULL";
                      goto LAB_0018a33b;
                    }
                    *puVar12 = uVar22;
                    puVar12 = puVar12 + -1;
                    uVar17 = (uint)uVar8;
                  }
                  puVar9 = puVar9 + -1;
                } while (SA + iVar2 <= puVar9);
              }
              bVar23 = uVar7 != 0;
              uVar7 = uVar7 - 1;
            } while (bVar23);
          }
          uVar7 = (ulong)T[n - 1U];
          uVar10 = ~(uint)T[(ulong)(uint)n - 2];
          if (T[n - 1U] <= T[(ulong)(uint)n - 2]) {
            uVar10 = n - 1U;
          }
          puVar9 = SA + (long)piVar4[uVar7] + 1;
          puVar9[-1] = uVar10;
          puVar12 = SA;
          puVar20 = SA;
          do {
            uVar10 = *puVar12;
            lVar18 = (long)(int)uVar10;
            if (lVar18 < 1) {
              puVar21 = puVar12;
              if (uVar10 != 0) {
                *puVar12 = ~uVar10;
                puVar21 = puVar20;
              }
            }
            else {
              if (T[lVar18 + -1] < T[lVar18]) {
                __assert_fail("T[s - 1] >= T[s]",
                              "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                              ,0xbb78,
                              "int construct_BWT(const unsigned char *, int *, int *, int *, int, int)"
                             );
              }
              bVar6 = T[uVar10 - 1];
              *puVar12 = (uint)bVar6;
              uVar17 = 0;
              if ((uVar10 != 1) && (uVar17 = uVar10 - 1, T[lVar18 + -2] < bVar6)) {
                uVar17 = ~(uint)T[lVar18 + -2];
              }
              if ((uint)uVar7 != (uint)bVar6) {
                piVar4[uVar7] = (int)((ulong)((long)puVar9 - (long)SA) >> 2);
                puVar9 = SA + piVar4[bVar6];
                uVar7 = (ulong)bVar6;
              }
              if (puVar9 <= puVar12) {
                __assert_fail("i < k",
                              "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                              ,48000,
                              "int construct_BWT(const unsigned char *, int *, int *, int *, int, int)"
                             );
              }
              *puVar9 = uVar17;
              puVar9 = puVar9 + 1;
              puVar21 = puVar20;
            }
            puVar12 = puVar12 + 1;
            puVar20 = puVar21;
          } while (puVar12 < SA + (uint)n);
        }
        else {
          uVar10 = (uint)n >> 4 | (uint)n >> 3;
          uVar10 = uVar10 >> 2 | uVar10;
          uVar10 = uVar10 >> 4 | uVar10;
          uVar10 = uVar10 >> 8 | uVar10;
          uVar15 = uVar10 >> 1 | uVar10 >> 0x11;
          uVar10 = n - 1;
          uVar17 = uVar15 + 1;
          *num_indexes = (uchar)((ulong)uVar10 / (ulong)uVar17);
          if (0 < iVar2) {
            uVar7 = 0xfe;
            do {
              uVar22 = (int)uVar7 << 8;
              iVar2 = bucket_B[(int)((int)uVar7 + 1U | uVar22)];
              if (SA + iVar2 <= SA + (long)piVar4[uVar7 + 1] + -1) {
                uVar3 = 0xffffffff;
                puVar9 = (uint *)0x0;
                uVar19 = (long)piVar4[uVar7 + 1] * 4;
                do {
                  uVar8 = uVar19 - 4;
                  puVar12 = (uint *)((long)SA + uVar8);
                  uVar1 = *(uint *)((long)SA + uVar8);
                  uVar13 = (ulong)uVar1;
                  if ((int)uVar1 < 1) {
                    if (uVar13 == 0) {
                      if (uVar7 != *T) {
                        __assert_fail("T[s] == c1",
                                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                                      ,0xbbbe,
                                      "int construct_BWT_indexes(const unsigned char *, int *, int *, int *, int, int, unsigned char *, int *)"
                                     );
                      }
                    }
                    else {
                      *puVar12 = ~uVar1;
                    }
                  }
                  else {
                    bVar6 = T[uVar13];
                    if (uVar7 != bVar6) {
                      __assert_fail("T[s] == c1",
                                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                                    ,0xbbab,
                                    "int construct_BWT_indexes(const unsigned char *, int *, int *, int *, int, int, unsigned char *, int *)"
                                   );
                    }
                    if ((n <= (int)(uVar13 + 1)) || (T[uVar13 + 1] < bVar6)) {
                      __assert_fail("((s + 1) < n) && (T[s] <= T[s + 1])",
                                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                                    ,0xbbac,
                                    "int construct_BWT_indexes(const unsigned char *, int *, int *, int *, int, int, unsigned char *, int *)"
                                   );
                    }
                    if (bVar6 < T[uVar13 - 1]) {
                      __assert_fail("T[s - 1] <= T[s]",
                                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                                    ,0xbbad,
                                    "int construct_BWT_indexes(const unsigned char *, int *, int *, int *, int, int, unsigned char *, int *)"
                                   );
                    }
                    if ((uVar1 & uVar15) == 0) {
                      indexes[(ulong)uVar1 / (ulong)uVar17 - 1] = (int)(uVar8 >> 2);
                    }
                    bVar6 = T[uVar1 - 1];
                    uVar5 = (ulong)bVar6;
                    *puVar12 = ~(uint)bVar6;
                    uVar11 = 0;
                    if ((uVar1 != 1) && (uVar11 = uVar1 - 1, bVar6 < T[uVar13 - 2])) {
                      uVar11 = -uVar1;
                    }
                    if (uVar3 == bVar6) {
                      uVar5 = (ulong)uVar3;
                    }
                    else {
                      if (-1 < (int)uVar3) {
                        bucket_B[(int)(uVar3 | uVar22)] =
                             (int)((ulong)((long)puVar9 - (long)SA) >> 2);
                      }
                      puVar9 = SA + bucket_B[(long)(int)uVar22 | uVar5];
                    }
                    if (puVar12 <= puVar9) {
                      pcVar14 = "k < j";
LAB_0018a35a:
                      __assert_fail(pcVar14,
                                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                                    ,0xbbb8,
                                    "int construct_BWT_indexes(const unsigned char *, int *, int *, int *, int, int, unsigned char *, int *)"
                                   );
                    }
                    if (puVar9 == (uint *)0x0) {
                      pcVar14 = "k != NULL";
                      goto LAB_0018a35a;
                    }
                    *puVar9 = uVar11;
                    puVar9 = puVar9 + -1;
                    uVar3 = (uint)uVar5;
                  }
                  lVar18 = uVar19 - 8;
                  uVar19 = uVar8;
                } while (SA + iVar2 <= (uint *)((long)SA + lVar18));
              }
              bVar23 = uVar7 != 0;
              uVar7 = uVar7 - 1;
            } while (bVar23);
          }
          uVar7 = (ulong)T[uVar10];
          iVar2 = piVar4[uVar7];
          bVar6 = T[(ulong)(uint)n - 2];
          if (bVar6 < T[uVar10]) {
            if ((uVar15 & uVar10) == 0) {
              indexes[(long)(int)((ulong)uVar10 / (ulong)uVar17) + -1] = iVar2;
              bVar6 = T[(ulong)(uint)n - 2];
            }
            uVar10 = ~(uint)bVar6;
          }
          SA[iVar2] = uVar10;
          puVar9 = SA + iVar2 + 1;
          iVar2 = 0;
          puVar12 = SA;
          puVar20 = SA;
          do {
            uVar10 = *puVar12;
            lVar18 = (long)(int)uVar10;
            if (lVar18 < 1) {
              puVar21 = puVar12;
              if (uVar10 != 0) {
                *puVar12 = ~uVar10;
                puVar21 = puVar20;
              }
            }
            else {
              if (T[lVar18 + -1] < T[lVar18]) {
                __assert_fail("T[s - 1] >= T[s]",
                              "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                              ,0xbbd3,
                              "int construct_BWT_indexes(const unsigned char *, int *, int *, int *, int, int, unsigned char *, int *)"
                             );
              }
              if ((uVar10 & uVar15) == 0) {
                indexes[(ulong)uVar10 / (ulong)uVar17 - 1] = iVar2;
              }
              uVar22 = uVar10 - 1;
              bVar6 = T[uVar22];
              *puVar12 = (uint)bVar6;
              if ((uint)uVar7 != (uint)bVar6) {
                piVar4[uVar7] = (int)((ulong)((long)puVar9 - (long)SA) >> 2);
                puVar9 = SA + piVar4[bVar6];
                uVar7 = (ulong)bVar6;
              }
              if (puVar9 <= puVar12) {
                __assert_fail("i < k",
                              "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                              ,0xbbdd,
                              "int construct_BWT_indexes(const unsigned char *, int *, int *, int *, int, int, unsigned char *, int *)"
                             );
              }
              if ((uVar10 == 1) || (bVar16 = T[lVar18 + -2], bVar6 <= bVar16)) {
                *puVar9 = uVar22;
              }
              else {
                if ((uVar22 & uVar15) == 0) {
                  indexes[(ulong)uVar22 / (ulong)uVar17 - 1] =
                       (int)((ulong)((long)puVar9 - (long)SA) >> 2);
                  bVar16 = T[lVar18 + -2];
                }
                *puVar9 = ~(uint)bVar16;
              }
              puVar9 = puVar9 + 1;
              puVar21 = puVar20;
            }
            puVar12 = puVar12 + 1;
            iVar2 = iVar2 + 1;
            puVar20 = puVar21;
          } while (puVar12 < SA + (uint)n);
        }
        *U = T[(ulong)(uint)n - 1];
        uVar10 = (uint)((ulong)((long)puVar21 - (long)SA) >> 2);
        if ((int)uVar10 < 1) {
          uVar17 = 0;
        }
        else {
          uVar7 = 0;
          do {
            U[uVar7 + 1] = (uchar)SA[uVar7];
            uVar7 = uVar7 + 1;
            uVar17 = uVar10;
          } while ((uVar10 & 0x7fffffff) != uVar7);
        }
        if ((int)(uVar17 + 1) < n) {
          lVar18 = 1;
          do {
            U[lVar18 + (ulong)uVar17] = (uchar)SA[(ulong)uVar17 + lVar18];
            lVar18 = lVar18 + 1;
          } while ((int)(uVar17 + (int)lVar18) < n);
        }
        iVar2 = uVar10 + 1;
      }
      free(bucket_B);
      free(piVar4);
      if (A == (int *)0x0) {
        free(SA);
      }
    }
  }
  return iVar2;
}

Assistant:

int
divbwt(const unsigned char *T, unsigned char *U, int *A, int n, unsigned char * num_indexes, int * indexes, int openMP) {
  int *B;
  int *bucket_A, *bucket_B;
  int m, pidx, i;

  /* Check arguments. */
  if((T == NULL) || (U == NULL) || (n < 0)) { return -1; }
  else if(n <= 1) { if(n == 1) { U[0] = T[0]; } return n; }

  if((B = A) == NULL) { B = (int *)malloc((size_t)(n + 1) * sizeof(int)); }
  bucket_A = (int *)malloc(BUCKET_A_SIZE * sizeof(int));
  bucket_B = (int *)malloc(BUCKET_B_SIZE * sizeof(int));

  /* Burrows-Wheeler Transform. */
  if((B != NULL) && (bucket_A != NULL) && (bucket_B != NULL)) {
    m = sort_typeBstar(T, B, bucket_A, bucket_B, n, openMP);

    if (num_indexes == NULL || indexes == NULL) {
        pidx = construct_BWT(T, B, bucket_A, bucket_B, n, m);
    } else {
        pidx = construct_BWT_indexes(T, B, bucket_A, bucket_B, n, m, num_indexes, indexes);
    }

    /* Copy to output string. */
    U[0] = T[n - 1];
    for(i = 0; i < pidx; ++i) { U[i + 1] = (unsigned char)B[i]; }
    for(i += 1; i < n; ++i) { U[i] = (unsigned char)B[i]; }
    pidx += 1;
  } else {
    pidx = -2;
  }

  free(bucket_B);
  free(bucket_A);
  if(A == NULL) { free(B); }

  return pidx;
}